

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_utils.h
# Opt level: O0

vector<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
* split(vector<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
        *__return_storage_ptr__,wcharstring *s,WCHAR separator)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  local_78;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  local_48;
  int local_24;
  int local_20;
  int pos;
  int prev_pos;
  WCHAR separator_local;
  wcharstring *s_local;
  vector<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
  *result;
  
  pos._1_1_ = 0;
  pos._2_2_ = separator;
  _prev_pos = s;
  s_local = (wcharstring *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
  ::vector(__return_storage_ptr__);
  local_20 = 0;
  for (local_24 = 0; uVar1 = (ulong)local_24,
      sVar2 = std::__cxx11::
              basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
              ::size(s), uVar1 <= sVar2; local_24 = local_24 + 1) {
    pvVar3 = std::__cxx11::
             basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
             ::operator[](s,(long)local_24);
    if (*pvVar3 == pos._2_2_) {
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::substr(&local_48,s,(long)local_20,(long)(local_24 - local_20));
      std::
      vector<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
      ::push_back(__return_storage_ptr__,&local_48);
      std::__cxx11::
      basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~basic_string(&local_48);
      local_24 = local_24 + 1;
      local_20 = local_24;
    }
  }
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  substr(&local_78,s,(long)local_20,(long)(local_24 - local_20));
  std::
  vector<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>_>
  ::push_back(__return_storage_ptr__,&local_78);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  ~basic_string(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<wcharstring> split(const wcharstring s, WCHAR separator)
{
    std::vector<std::basic_string<WCHAR> > result;

    int prev_pos = 0, pos = 0;
    while(pos <= s.size()){
        if(s[pos] == separator){
            result.push_back(s.substr(prev_pos, pos-prev_pos));
            prev_pos = ++pos;
        }
        pos++;
    }

    result.push_back(s.substr(prev_pos, pos-prev_pos));

    return result;
}